

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

quaternion * quaternion_normalize(quaternion *self)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (self->field_0).q[3] * (self->field_0).q[3] +
          (self->field_0).q[2] * (self->field_0).q[2] +
          (self->field_0).q[0] * (self->field_0).q[0] + (self->field_0).q[1] * (self->field_0).q[1];
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = -dVar1;
  if (-dVar1 <= dVar1) {
    dVar2 = dVar1;
  }
  if (1e-05 <= dVar2) {
    dVar2 = (self->field_0).q[1];
    (self->field_0).q[0] = (self->field_0).q[0] / dVar1;
    (self->field_0).q[1] = dVar2 / dVar1;
    (self->field_0).q[2] = (self->field_0).q[2] / dVar1;
    (self->field_0).q[3] = (self->field_0).q[3] / dVar1;
  }
  return self;
}

Assistant:

HYPAPI struct quaternion *quaternion_normalize(struct quaternion *self)
{
	HYP_FLOAT mag;

	mag = quaternion_magnitude(self);

	if (scalar_equalsf(mag, 0.0f)) {
		/* can't normalize a zero
		 * avoid divide by zero
		 */
		return self;
	}

	self->x /= mag;
	self->y /= mag;
	self->z /= mag;
	self->w /= mag;

	return self;
}